

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GtestReportText.cpp
# Opt level: O3

string * __thiscall
oout::GtestReportText::asString_abi_cxx11_(string *__return_storage_ptr__,GtestReportText *this)

{
  ostream *poVar1;
  size_t sVar2;
  shared_ptr<const_oout::Result> *result;
  FmtText format;
  ostringstream out;
  CountFailure local_1c0;
  element_type local_1b0 [2];
  undefined **local_1a0;
  CountTest local_198 [7];
  ios_base local_128 [264];
  
  result = &this->result;
  CountTest::CountTest(local_198,result);
  CountTest::count(local_198);
  if (local_198[0].result.super___shared_ptr<const_oout::Result,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_198[0].result.
               super___shared_ptr<const_oout::Result,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)
    ;
  }
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_198);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_198,"[==========] Running ",0x15);
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)local_198);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1," tests",6);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar1 + -0x18) + (char)poVar1);
  std::ostream::put((char)poVar1);
  std::ostream::flush();
  local_1a0 = &PTR__Format_00198a50;
  (*((result->super___shared_ptr<const_oout::Result,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->
    _vptr_Result[2])(&local_1c0);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_198,
             (char *)local_1c0.result.
                     super___shared_ptr<const_oout::Result,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
             (long)local_1c0.result.
                   super___shared_ptr<const_oout::Result,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                   _M_pi);
  if (local_1c0.result.super___shared_ptr<const_oout::Result,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
      local_1b0) {
    operator_delete(local_1c0.result.
                    super___shared_ptr<const_oout::Result,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
                    (long)local_1b0[0]._vptr_Result + 1);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_198,"[==========] ",0xd);
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)local_198);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1," tests ran.",0xb);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar1 + -0x18) + (char)poVar1);
  std::ostream::put((char)poVar1);
  std::ostream::flush();
  CountFailure::CountFailure(&local_1c0,result);
  sVar2 = CountFailure::count(&local_1c0);
  if (local_1c0.result.super___shared_ptr<const_oout::Result,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_1c0.result.super___shared_ptr<const_oout::Result,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_198,"[  PASSED  ] ",0xd);
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)local_198);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1," test.",6);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar1 + -0x18) + (char)poVar1);
  std::ostream::put((char)poVar1);
  std::ostream::flush();
  if (sVar2 != 0) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_198,"[  FAILED  ] ",0xd);
    poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)local_198);
    std::__ostream_insert<char,std::char_traits<char>>(poVar1," test.",6);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar1 + -0x18) + (char)poVar1);
    std::ostream::put((char)poVar1);
    std::ostream::flush();
    poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)local_198);
    std::__ostream_insert<char,std::char_traits<char>>(poVar1," FAILED TEST",0xc);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar1 + -0x18) + (char)poVar1);
    std::ostream::put((char)poVar1);
    std::ostream::flush();
  }
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_198);
  std::ios_base::~ios_base(local_128);
  return __return_storage_ptr__;
}

Assistant:

string GtestReportText::asString() const
{
	const auto test_count = CountTest(result).count();
	ostringstream out;
	// @todo #82:15min gtest count of test cases. Is it need for me?
	out << "[==========] Running " << test_count << " tests" << endl;
	FmtText format;
	out << result->print(format);
	// @todo #82:15min gtest show total seconds.
	//  I have root suite, and this value show on inner level
	out << "[==========] " << test_count << " tests ran." << endl;

	const auto failure_count = CountFailure(result).count();
	out << "[  PASSED  ] " << test_count - failure_count << " test." << endl;
	if (failure_count > 0) {
		out << "[  FAILED  ] " << failure_count << " test." << endl;
		// @todo #82:15min gtest show list of failure tests.
		//  I can do this with special formatter
		out << failure_count << " FAILED TEST" << endl;
	}
	return out.str();
}